

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_public.c
# Opt level: O0

void nng_http_close(nng_http *conn)

{
  nng_http *conn_local;
  
  nni_http_conn_fini(conn);
  return;
}

Assistant:

void
nng_http_close(nng_http *conn)
{
#ifdef NNG_SUPP_HTTP
	// API version of this closes *and* frees the structure.
	nni_http_conn_fini(conn);
#else
	NNI_ARG_UNUSED(conn);
#endif
}